

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O1

int formparse(Configurable *config,char *input,curl_httppost **httppost,curl_httppost **last_post,
             _Bool literal_value)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  ushort **ppuVar6;
  size_t sVar7;
  size_t sVar8;
  multi_files *pmVar9;
  void *__ptr;
  ulong uVar10;
  char cVar11;
  long lVar12;
  char *pcVar13;
  multi_files **ppmVar14;
  undefined7 in_register_00000081;
  uint uVar15;
  uint uVar16;
  bool bVar17;
  multi_files *multi_current;
  multi_files *multi_start;
  char type_major [128];
  char type_minor [128];
  char name [256];
  char *local_280;
  int local_274;
  char *local_270;
  multi_files *local_268;
  multi_files *local_260;
  Configurable *local_258;
  char *local_250;
  curl_httppost **local_248;
  curl_httppost **local_240;
  undefined4 local_238 [2];
  undefined1 *local_230;
  undefined4 local_228 [2];
  char *local_220;
  char local_1b8 [128];
  undefined1 local_138 [264];
  
  pcVar13 = (char *)(CONCAT71(in_register_00000081,literal_value) & 0xffffffff);
  iVar2 = __isoc99_sscanf(input,"%255[^=]=",local_138);
  if ((iVar2 != 1) || (pcVar3 = strchr(input,0x3d), pcVar3 == (char *)0x0)) {
    warnf(config,"Illegally formatted input field!\n");
    return 1;
  }
  local_280 = strdup(pcVar3 + 1);
  if (local_280 == (char *)0x0) {
    curl_mfprintf(config->errors,"out of memory\n");
    return 1;
  }
  cVar11 = (char)pcVar13;
  if (*local_280 == '@' && cVar11 == '\0') {
    local_260 = (multi_files *)0x0;
    local_268 = (multi_files *)0x0;
    pcVar13 = local_280 + 1;
    local_258 = config;
    local_248 = httppost;
    local_240 = last_post;
    do {
      pcVar4 = strchr(pcVar13,0x3b);
      pcVar5 = strchr(pcVar13,0x2c);
      pcVar3 = pcVar4;
      if (pcVar5 < pcVar4) {
        pcVar3 = pcVar5;
      }
      if (pcVar5 == (char *)0x0) {
        pcVar3 = pcVar4;
      }
      local_250 = pcVar13;
      if (pcVar3 == (char *)0x0) {
        pcVar13 = (char *)0x0;
        pcVar4 = (char *)0x0;
        local_270 = (char *)0x0;
LAB_001094c2:
        pcVar3 = local_250;
        pmVar9 = AddMultiFiles(local_250,pcVar13,local_270,&local_260,&local_268);
        bVar17 = true;
        pcVar13 = pcVar4;
        if (pmVar9 == (multi_files *)0x0) {
          warnf(local_258,"Error building form post!\n");
          if (local_280 != (char *)0x0) {
            free(local_280);
          }
          FreeMultiInfo(&local_260,&local_268);
          local_274 = 3;
          local_280 = (char *)0x0;
          bVar17 = false;
          pcVar13 = pcVar3;
        }
      }
      else {
        cVar11 = *pcVar3;
        pcVar4 = pcVar3 + 1;
        *pcVar3 = '\0';
        bVar1 = true;
        bVar17 = cVar11 == ';';
        if (bVar17) {
          local_270 = (char *)0x0;
          pcVar13 = (char *)0x0;
          while (*pcVar4 != ',') {
            ppuVar6 = __ctype_b_loc();
            pcVar4 = pcVar4 + -1;
            do {
              pcVar5 = pcVar4;
              pcVar4 = pcVar5 + 1;
            } while ((*(byte *)((long)*ppuVar6 + (ulong)(byte)pcVar5[1] * 2 + 1) & 0x20) != 0);
            iVar2 = Curl_raw_nequal("type=",pcVar4,5);
            if (iVar2 == 0) {
              iVar2 = Curl_raw_nequal("filename=",pcVar4,9);
              if (iVar2 == 0) break;
              local_270 = pcVar5 + 10;
              pcVar5 = strchr(local_270,0x3b);
              if (pcVar5 == (char *)0x0) {
                pcVar5 = strchr(local_270,0x2c);
              }
              if (pcVar5 == (char *)0x0) {
                pcVar4 = (char *)0x0;
              }
              else {
LAB_0010940f:
                *pcVar5 = '\0';
                pcVar4 = pcVar5 + 1;
              }
            }
            else {
              pcVar13 = pcVar5 + 6;
              iVar2 = __isoc99_sscanf(pcVar13,"%127[^/]/%127[^;,\n]",local_238);
              if (iVar2 != 2) {
                warnf(local_258,"Illegally formatted content-type field!\n");
                if (local_280 != (char *)0x0) {
                  free(local_280);
                }
                pcVar13 = pcVar5 + 6;
                FreeMultiInfo(&local_260,&local_268);
                local_274 = 2;
                local_280 = (char *)0x0;
                bVar1 = false;
                pcVar4 = pcVar3;
                goto LAB_001094bd;
              }
              sVar7 = strlen((char *)local_238);
              sVar8 = strlen(local_1b8);
              lVar12 = sVar8 + sVar7;
              pcVar3 = pcVar4 + lVar12 + 6;
              pcVar5 = pcVar3;
              if (*pcVar3 == ';') {
                iVar2 = Curl_raw_nequal(";filename=",pcVar3,10);
                if ((iVar2 == 0) &&
                   (pcVar5 = strchr(pcVar4 + lVar12 + 7,0x3b), pcVar5 == (char *)0x0)) {
                  sVar7 = strlen(pcVar3);
                  pcVar5 = pcVar4 + sVar7 + lVar12 + 6;
                }
              }
              else {
                bVar17 = false;
              }
              pcVar3 = pcVar5;
              if (*pcVar5 != '\0') goto LAB_0010940f;
              pcVar4 = (char *)0x0;
            }
            if ((!bVar17) || (pcVar4 == (char *)0x0)) break;
          }
          bVar1 = true;
        }
        else {
          local_270 = (char *)0x0;
          pcVar13 = (char *)0x0;
        }
LAB_001094bd:
        if (bVar1) goto LAB_001094c2;
        bVar17 = false;
        pcVar13 = local_250;
      }
      if (!bVar17) {
        bVar17 = false;
        goto joined_r0x001097c4;
      }
    } while ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0'));
    bVar17 = true;
    if (local_260 == (multi_files *)0x0) goto joined_r0x001097c4;
    pmVar9 = local_260;
    uVar16 = 0;
    do {
      uVar15 = uVar16;
      pmVar9 = pmVar9->next;
      uVar16 = uVar15 + 1;
    } while (pmVar9 != (multi_files *)0x0);
    __ptr = malloc((ulong)(uVar15 + 2) << 4);
    if (__ptr == (void *)0x0) {
      curl_mfprintf(local_258->errors,"Error building form post!\n");
      if (local_280 != (char *)0x0) {
        free(local_280);
      }
      FreeMultiInfo(&local_260,&local_268);
      local_274 = 4;
    }
    else {
      ppmVar14 = &local_260;
      if (uVar16 != 0) {
        lVar12 = 0;
        do {
          pmVar9 = *ppmVar14;
          *(CURLformoption *)((long)__ptr + lVar12) = (pmVar9->form).option;
          *(char **)((long)__ptr + lVar12 + 8) = (pmVar9->form).value;
          ppmVar14 = &pmVar9->next;
          lVar12 = lVar12 + 0x10;
        } while ((ulong)uVar16 << 4 != lVar12);
      }
      *(undefined4 *)((long)__ptr + (ulong)uVar16 * 0x10) = 0x11;
      FreeMultiInfo(&local_260,&local_268);
      iVar2 = curl_formadd(local_248,local_240,1,local_138,8,__ptr,0x11);
      if (iVar2 == 0) {
        free(__ptr);
        bVar17 = true;
        goto joined_r0x001097c4;
      }
      warnf(local_258,"curl_formadd failed!\n");
      free(__ptr);
      local_274 = 5;
      if (local_280 == (char *)0x0) {
        local_280 = (char *)0x0;
        bVar17 = false;
        goto joined_r0x001097c4;
      }
      free(local_280);
    }
    local_280 = (char *)0x0;
    bVar17 = false;
    goto joined_r0x001097c4;
  }
  if (cVar11 == '\0') {
    pcVar3 = strstr(local_280,";type=");
  }
  else {
    pcVar3 = (char *)0x0;
  }
  local_238[0] = 1;
  if (pcVar3 == (char *)0x0) {
    iVar2 = 1;
  }
  else {
    local_228[0] = 0xe;
    local_220 = pcVar3 + 6;
    *pcVar3 = '\0';
    iVar2 = 2;
  }
  uVar10 = (ulong)(uint)(iVar2 << 4);
  local_230 = local_138;
  if (*local_280 == '<' && cVar11 == '\0') {
    *(undefined4 *)((long)local_238 + uVar10) = 7;
    pcVar13 = local_280 + 1;
    *(char **)((long)local_228 + (uVar10 - 8)) = pcVar13;
    *(undefined4 *)(uVar10 + 0x10 + (long)local_238) = 0x11;
    iVar2 = curl_formadd(httppost,last_post,8,local_238,0x11);
    if (iVar2 != 0) {
      warnf(config,"curl_formadd failed, possibly the file %s is bad!\n",pcVar13);
      local_274 = 6;
      goto LAB_00109746;
    }
  }
  else {
    *(undefined4 *)((long)local_238 + uVar10) = 4;
    *(char **)((long)local_228 + (uVar10 - 8)) = local_280;
    *(undefined4 *)(uVar10 + 0x10 + (long)local_238) = 0x11;
    iVar2 = curl_formadd(httppost,last_post,8,local_238,0x11);
    if (iVar2 != 0) {
      warnf(config,"curl_formadd failed!\n");
      local_274 = 8;
LAB_00109746:
      free(local_280);
      local_280 = (char *)0x0;
      bVar17 = false;
      goto joined_r0x001097c4;
    }
  }
  local_274 = (int)pcVar13;
  bVar17 = true;
joined_r0x001097c4:
  if (!bVar17) {
    return local_274;
  }
  if (local_280 != (char *)0x0) {
    free(local_280);
    return 0;
  }
  return 0;
}

Assistant:

int formparse(struct Configurable *config,
              const char *input,
              struct curl_httppost **httppost,
              struct curl_httppost **last_post,
              bool literal_value)
{
  /* nextarg MUST be a string in the format 'name=contents' and we'll
     build a linked list with the info */
  char name[256];
  char *contents = NULL;
  char type_major[128];
  char type_minor[128];
  char *contp;
  const char *type = NULL;
  char *sep;
  char *sep2;

  if((1 == sscanf(input, "%255[^=]=", name)) &&
     ((contp = strchr(input, '=')) != NULL)) {
    /* the input was using the correct format */

    /* Allocate the contents */
    contents = strdup(contp+1);
    if(!contents) {
      fprintf(config->errors, "out of memory\n");
      return 1;
    }
    contp = contents;

    if('@' == contp[0] && !literal_value) {

      /* we use the @-letter to indicate file name(s) */

      struct multi_files *multi_start = NULL;
      struct multi_files *multi_current = NULL;

      contp++;

      do {
        /* since this was a file, it may have a content-type specifier
           at the end too, or a filename. Or both. */
        char *ptr;
        char *filename = NULL;

        sep = strchr(contp, ';');
        sep2 = strchr(contp, ',');

        /* pick the closest */
        if(sep2 && (sep2 < sep)) {
          sep = sep2;

          /* no type was specified! */
        }

        type = NULL;

        if(sep) {
          bool semicolon = (';' == *sep) ? TRUE : FALSE;

          *sep = '\0'; /* terminate file name at separator */

          ptr = sep+1; /* point to the text following the separator */

          while(semicolon && ptr && (','!= *ptr)) {

            /* pass all white spaces */
            while(ISSPACE(*ptr))
              ptr++;

            if(checkprefix("type=", ptr)) {
              /* set type pointer */
              type = &ptr[5];

              /* verify that this is a fine type specifier */
              if(2 != sscanf(type, "%127[^/]/%127[^;,\n]",
                             type_major, type_minor)) {
                warnf(config, "Illegally formatted content-type field!\n");
                Curl_safefree(contents);
                FreeMultiInfo(&multi_start, &multi_current);
                return 2; /* illegal content-type syntax! */
              }

              /* now point beyond the content-type specifier */
              sep = (char *)type + strlen(type_major)+strlen(type_minor)+1;

              /* there's a semicolon following - we check if it is a filename
                 specified and if not we simply assume that it is text that
                 the user wants included in the type and include that too up
                 to the next zero or semicolon. */
              if(*sep==';') {
                if(!checkprefix(";filename=", sep)) {
                  sep2 = strchr(sep+1, ';');
                  if(sep2)
                    sep = sep2;
                  else
                    sep = sep + strlen(sep); /* point to end of string */
                }
              }
              else
                semicolon = FALSE;

              if(*sep) {
                *sep = '\0'; /* zero terminate type string */

                ptr = sep+1;
              }
              else
                ptr = NULL; /* end */
            }
            else if(checkprefix("filename=", ptr)) {
              filename = &ptr[9];
              ptr = strchr(filename, ';');
              if(!ptr) {
                ptr = strchr(filename, ',');
              }
              if(ptr) {
                *ptr = '\0'; /* zero terminate */
                ptr++;
              }
            }
            else
              /* confusion, bail out of loop */
              break;
          }

          sep = ptr;
        }

        /* if type == NULL curl_formadd takes care of the problem */

        if(!AddMultiFiles(contp, type, filename, &multi_start,
                          &multi_current)) {
          warnf(config, "Error building form post!\n");
          Curl_safefree(contents);
          FreeMultiInfo(&multi_start, &multi_current);
          return 3;
        }
        contp = sep; /* move the contents pointer to after the separator */

      } while(sep && *sep); /* loop if there's another file name */

      /* now we add the multiple files section */
      if(multi_start) {
        struct curl_forms *forms = NULL;
        struct multi_files *ptr = multi_start;
        unsigned int i, count = 0;
        while(ptr) {
          ptr = ptr->next;
          ++count;
        }
        forms = malloc((count+1)*sizeof(struct curl_forms));
        if(!forms) {
          fprintf(config->errors, "Error building form post!\n");
          Curl_safefree(contents);
          FreeMultiInfo(&multi_start, &multi_current);
          return 4;
        }
        for(i = 0, ptr = multi_start; i < count; ++i, ptr = ptr->next) {
          forms[i].option = ptr->form.option;
          forms[i].value = ptr->form.value;
        }
        forms[count].option = CURLFORM_END;
        FreeMultiInfo(&multi_start, &multi_current);
        if(curl_formadd(httppost, last_post,
                        CURLFORM_COPYNAME, name,
                        CURLFORM_ARRAY, forms, CURLFORM_END) != 0) {
          warnf(config, "curl_formadd failed!\n");
          Curl_safefree(forms);
          Curl_safefree(contents);
          return 5;
        }
        Curl_safefree(forms);
      }
    }
    else {
      struct curl_forms info[4];
      int i = 0;
      char *ct = literal_value ? NULL : strstr(contp, ";type=");

      info[i].option = CURLFORM_COPYNAME;
      info[i].value = name;
      i++;

      if(ct) {
        info[i].option = CURLFORM_CONTENTTYPE;
        info[i].value = &ct[6];
        i++;
        ct[0] = '\0'; /* zero terminate here */
      }

      if(contp[0]=='<' && !literal_value) {
        info[i].option = CURLFORM_FILECONTENT;
        info[i].value = contp+1;
        i++;
        info[i].option = CURLFORM_END;

        if(curl_formadd(httppost, last_post,
                        CURLFORM_ARRAY, info, CURLFORM_END ) != 0) {
          warnf(config, "curl_formadd failed, possibly the file %s is bad!\n",
                contp+1);
          Curl_safefree(contents);
          return 6;
        }
      }
      else {
#ifdef CURL_DOES_CONVERSIONS
        if(convert_to_network(contp, strlen(contp))) {
          warnf(config, "curl_formadd failed!\n");
          Curl_safefree(contents);
          return 7;
        }
#endif
        info[i].option = CURLFORM_COPYCONTENTS;
        info[i].value = contp;
        i++;
        info[i].option = CURLFORM_END;
        if(curl_formadd(httppost, last_post,
                        CURLFORM_ARRAY, info, CURLFORM_END) != 0) {
          warnf(config, "curl_formadd failed!\n");
          Curl_safefree(contents);
          return 8;
        }
      }
    }

  }
  else {
    warnf(config, "Illegally formatted input field!\n");
    return 1;
  }
  Curl_safefree(contents);
  return 0;
}